

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O0

bool si9ma::SinglyLinkedList::is_palindroom2(SinglyNodeWithRand *head)

{
  int iVar1;
  SinglyNodeWithRand *pSVar2;
  reference pvVar3;
  undefined1 local_70 [8];
  stack<int,_std::deque<int,_std::allocator<int>_>_> s_stack;
  SinglyNodeWithRand *ptr;
  SinglyNodeWithRand *head_local;
  
  s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)head;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)local_70);
  for (; pSVar2 = head,
      s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node != (_Map_pointer)0x0;
      s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node =
           (_Map_pointer)
           *s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node) {
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_70,
               (value_type *)
               (s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node + 2));
  }
  do {
    s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node = (_Map_pointer)pSVar2;
    if (s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node == (_Map_pointer)0x0) {
      head_local._7_1_ = true;
LAB_0010ef8a:
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_70);
      return head_local._7_1_;
    }
    iVar1 = *(int *)(s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 2);
    pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                       ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_70);
    if (iVar1 != *pvVar3) {
      head_local._7_1_ = false;
      goto LAB_0010ef8a;
    }
    s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node = (_Map_pointer)
              *s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
               ._M_finish._M_node;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_70);
    pSVar2 = (SinglyNodeWithRand *)
             s_stack.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_node;
  } while( true );
}

Assistant:

bool SinglyLinkedList::is_palindroom2(si9ma::SinglyNodeWithRand *head) {
        auto *ptr = head;
        stack<int> s_stack;
        while (ptr != nullptr){
            s_stack.push(ptr->value);
            ptr = ptr->next;
        }

        ptr = head;
        while (ptr != nullptr){
            if (ptr->value != s_stack.top())
                return false;

            ptr = ptr->next;
            s_stack.pop();
        }

        return true;
    }